

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O1

int ps_alignment_iter_seg(ps_alignment_iter_t *itor,int *start,int *duration)

{
  ps_alignment_entry_t *ppVar1;
  
  if (itor != (ps_alignment_iter_t *)0x0) {
    ppVar1 = itor->vec->seq + itor->pos;
    if (start != (int *)0x0) {
      *start = ppVar1->start;
    }
    if (duration != (int *)0x0) {
      *duration = ppVar1->duration;
    }
    return ppVar1->score;
  }
  return 0;
}

Assistant:

int
ps_alignment_iter_seg(ps_alignment_iter_t *itor, int *start, int *duration)
{
    ps_alignment_entry_t *ent;
    if (itor == NULL)
        return 0;
    ent = ps_alignment_iter_get(itor);
    if (start)
        *start = ent->start;
    if (duration)
        *duration = ent->duration;
    return ent->score;
}